

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_view_lookat_rh_EXP(matrix4 *self,vector3 *eye,vector3 *target,vector3 *up)

{
  float fVar1;
  undefined1 local_4c [8];
  vector3 xaxis;
  vector3 zaxis;
  vector3 yaxis;
  vector3 *up_local;
  vector3 *target_local;
  vector3 *eye_local;
  matrix4 *self_local;
  
  xaxis.field_0.v[1] = (target->field_0).v[0] - (eye->field_0).v[0];
  xaxis.field_0.v[2] = (target->field_0).v[1] - (eye->field_0).v[1];
  zaxis.field_0.v[0] = (target->field_0).v[2] - (eye->field_0).v[2];
  vector3_normalize((vector3 *)((long)&xaxis.field_0 + 4));
  vector3_cross_product((vector3 *)local_4c,(vector3 *)((long)&xaxis.field_0 + 4),up);
  vector3_normalize((vector3 *)local_4c);
  vector3_cross_product
            ((vector3 *)((long)&zaxis.field_0 + 4),(vector3 *)local_4c,
             (vector3 *)((long)&xaxis.field_0 + 4));
  matrix4_identity(self);
  (self->field_0).m[0] = (float)local_4c._0_4_;
  (self->field_0).m[1] = (float)local_4c._4_4_;
  (self->field_0).m[2] = xaxis.field_0.v[0];
  (self->field_0).m[4] = zaxis.field_0.v[1];
  (self->field_0).m[5] = zaxis.field_0.v[2];
  (self->field_0).m[6] = yaxis.field_0.v[0];
  (self->field_0).m[8] = -xaxis.field_0.v[1];
  (self->field_0).m[9] = -xaxis.field_0.v[2];
  (self->field_0).m[10] = -zaxis.field_0.v[0];
  fVar1 = vector3_dot_product((vector3 *)local_4c,eye);
  (self->field_0).m[3] = -fVar1;
  fVar1 = vector3_dot_product((vector3 *)((long)&zaxis.field_0 + 4),eye);
  (self->field_0).m[7] = -fVar1;
  fVar1 = vector3_dot_product((vector3 *)((long)&xaxis.field_0 + 4),eye);
  (self->field_0).m[0xb] = -fVar1;
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_view_lookat_rh_EXP(struct matrix4 *self, const struct vector3 *eye, const struct vector3 *target, const struct vector3 *up)
{
	struct vector3 yaxis;
	struct vector3 zaxis;
	struct vector3 xaxis;

	zaxis.x = target->x - eye->x;
	zaxis.y = target->y - eye->y;
	zaxis.z = target->z - eye->z;
	vector3_normalize(&zaxis);

	/* xaxis = zaxis x up */
	vector3_cross_product(&xaxis, &zaxis, up);
	vector3_normalize(&xaxis);

	/* yaxis = xaxis x zaxis */
	vector3_cross_product(&yaxis, &xaxis, &zaxis);

	matrix4_identity(self);

	self->c00 = xaxis.x;
	self->c10 = xaxis.y;
	self->c20 = xaxis.z;

	self->c01 = yaxis.x;
	self->c11 = yaxis.y;
	self->c21 = yaxis.z;

	self->c02 = -zaxis.x;
	self->c12 = -zaxis.y;
	self->c22 = -zaxis.z;

	self->c30 = -vector3_dot_product(&xaxis, eye);
	self->c31 = -vector3_dot_product(&yaxis, eye);
	self->c32 = -vector3_dot_product(&zaxis, eye);

	return self;
}